

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O2

CURLcode Curl_getinfo(Curl_easy *data,CURLINFO info,...)

{
  int iVar1;
  ip_quadruple *piVar2;
  connectdata *pcVar3;
  curl_socket_t cVar4;
  curl_sslbackend cVar5;
  void *pvVar6;
  byte bVar7;
  ip_quadruple *piVar8;
  pgrs_dir *ppVar9;
  curl_tlssessioninfo **tsip;
  CURLcode CVar10;
  double dVar11;
  curl_slist *pcStack_100;
  va_list arg;
  double *local_c8;
  
  if (data == (Curl_easy *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  CVar10 = CURLE_UNKNOWN_OPTION;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      piVar8 = (ip_quadruple *)(data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      piVar8 = (ip_quadruple *)(data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      piVar8 = &(data->info).primary;
      break;
    case 0x100021:
    case 0x100022:
    case 0x100023:
    case 0x100025:
    case 0x100026:
    case 0x100027:
    case 0x100028:
      goto switchD_0012df55_default;
    case CURLINFO_RTSP_SESSION_ID:
      piVar8 = (ip_quadruple *)(data->set).str[0x33];
      break;
    case CURLINFO_LOCAL_IP:
      piVar8 = (ip_quadruple *)(data->info).primary.local_ip;
      break;
    default:
      switch(info) {
      case CURLINFO_EFFECTIVE_METHOD:
        piVar8 = (ip_quadruple *)(data->set).str[0x1c];
        if (piVar8 == (ip_quadruple *)0x0) {
          if (((data->set).field_0x897 & 0x20) == 0) {
            bVar7 = (data->state).httpreq - 1;
            if (bVar7 < 5) {
              piVar8 = (ip_quadruple *)(&DAT_00174ae4 + *(int *)(&DAT_00174ae4 + (ulong)bVar7 * 4));
            }
            else {
              piVar8 = (ip_quadruple *)0x1754fb;
            }
          }
          else {
            piVar8 = (ip_quadruple *)0x17b879;
          }
        }
        break;
      case 0x10003b:
        goto switchD_0012df55_default;
      case CURLINFO_REFERER:
        piVar8 = (ip_quadruple *)(data->state).referer;
        break;
      case CURLINFO_CAINFO:
        piVar8 = (ip_quadruple *)"/etc/ssl/certs/ca-certificates.crt";
        break;
      case CURLINFO_CAPATH:
        piVar8 = (ip_quadruple *)"/etc/ssl/certs";
        break;
      default:
        if (info == CURLINFO_SCHEME) {
          piVar8 = (ip_quadruple *)(data->info).conn_scheme;
        }
        else if (info == CURLINFO_CONTENT_TYPE) {
          piVar8 = (ip_quadruple *)(data->info).contenttype;
        }
        else if (info == CURLINFO_PRIVATE) {
          piVar8 = (ip_quadruple *)(data->set).private_data;
        }
        else {
          if (info != CURLINFO_EFFECTIVE_URL) {
            return CURLE_UNKNOWN_OPTION;
          }
          piVar2 = (ip_quadruple *)(data->state).url;
          piVar8 = (ip_quadruple *)0x17d8ea;
          if (piVar2 != (ip_quadruple *)0x0) {
            piVar8 = piVar2;
          }
        }
      }
    }
    goto LAB_0012e6a6;
  case 1:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_HEADER_SIZE:
      pcStack_100 = (curl_slist *)(ulong)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcStack_100 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcStack_100 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcStack_100 = (curl_slist *)(data->info).filetime;
      break;
    case 0x20000f:
    case 0x200010:
    case 0x200011:
    case 0x200012:
    case 0x200013:
    case 0x200015:
    case 0x20001b:
    case 0x20001c:
    case 0x20001e:
    case 0x20001f:
    case 0x200020:
    case 0x200021:
    case 0x200022:
    case 0x200024:
    case 0x200029:
    case 0x20002b:
    case 0x20002c:
    case 0x20002d:
    case 0x200031:
    case 0x200032:
    case 0x200033:
    case 0x200034:
    case 0x200035:
    case 0x200036:
    case 0x200037:
    case 0x200038:
    case 0x200039:
    case 0x20003a:
    case 0x20003c:
    case 0x20003d:
    case 0x20003e:
    case 0x20003f:
    case 0x200040:
    case 0x200041:
    case 0x200043:
    case 0x200044:
      goto switchD_0012df55_default;
    case CURLINFO_REDIRECT_COUNT:
      pcStack_100 = (curl_slist *)(data->state).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcStack_100 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcStack_100 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcStack_100 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcStack_100 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcStack_100 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
      pcStack_100 = (curl_slist *)(long)cVar4;
      break;
    case CURLINFO_CONDITION_UNMET:
      if ((data->info).httpcode != 0x130) {
        bVar7 = (data->info).field_0xf4;
        goto LAB_0012e685;
      }
LAB_0012e698:
      pcStack_100 = (curl_slist *)0x1;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      pcStack_100 = (curl_slist *)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      pcStack_100 = (curl_slist *)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      pcStack_100 = (curl_slist *)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      pcStack_100 = (curl_slist *)(long)(data->info).primary.remote_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcStack_100 = (curl_slist *)(long)(data->info).primary.local_port;
      break;
    case CURLINFO_HTTP_VERSION:
      iVar1 = (data->info).httpversion;
      if (iVar1 == 10) goto LAB_0012e698;
      if (iVar1 == 0x1e) {
        pcStack_100 = (curl_slist *)0x1e;
      }
      else if (iVar1 == 0x14) {
        pcStack_100 = (curl_slist *)0x3;
      }
      else if (iVar1 == 0xb) {
        pcStack_100 = (curl_slist *)0x2;
      }
      else {
        pcStack_100 = (curl_slist *)0x0;
      }
      break;
    case CURLINFO_PROXY_SSL_VERIFYRESULT:
      pcStack_100 = (curl_slist *)(data->set).proxy_ssl.certverifyresult;
      break;
    case CURLINFO_PROTOCOL:
      pcStack_100 = (curl_slist *)(ulong)(data->info).conn_protocol;
      break;
    case CURLINFO_PROXY_ERROR:
      pcStack_100 = (curl_slist *)(ulong)(data->info).pxcode;
      break;
    case CURLINFO_USED_PROXY:
      bVar7 = (byte)(data->info).field_0xf4 >> 1;
LAB_0012e685:
      pcStack_100 = (curl_slist *)(ulong)(bVar7 & 1);
      break;
    case CURLINFO_HTTPAUTH_USED:
      pcStack_100 = (curl_slist *)(data->info).httpauthpicked;
      break;
    case CURLINFO_PROXYAUTH_USED:
      pcStack_100 = (curl_slist *)(data->info).proxyauthpicked;
      break;
    default:
      if (info != CURLINFO_RESPONSE_CODE) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcStack_100 = (curl_slist *)(long)(data->info).httpcode;
    }
LAB_0012e6bb:
    *local_c8 = (double)pcStack_100;
    goto LAB_0012e6bf;
  case 2:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    break;
  case 3:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (info == CURLINFO_TLS_SSL_PTR) {
LAB_0012e265:
      pcVar3 = data->conn;
      *local_c8 = (double)&data->tsi;
      cVar5 = Curl_ssl_backend();
      (data->tsi).backend = cVar5;
      (data->tsi).internals = (void *)0x0;
      if (cVar5 == CURLSSLBACKEND_NONE || pcVar3 == (connectdata *)0x0) {
        return CURLE_OK;
      }
      pvVar6 = Curl_ssl_get_internals(data,0,info,0);
      (data->tsi).internals = pvVar6;
      return CURLE_OK;
    }
    if (info == CURLINFO_COOKIELIST) {
      pcStack_100 = Curl_cookie_list(data);
      goto LAB_0012e6bb;
    }
    if (info != CURLINFO_CERTINFO) {
      if (info == CURLINFO_TLS_SESSION) goto LAB_0012e265;
      if (info != CURLINFO_SSL_ENGINES) {
        return CURLE_UNKNOWN_OPTION;
      }
      pcStack_100 = Curl_ssl_engines_list(data);
      goto LAB_0012e6bb;
    }
    *local_c8 = (double)&(data->info).certs;
    goto LAB_0012e6bf;
  case 4:
    if (info != CURLINFO_ACTIVESOCKET) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    cVar4 = Curl_getconnectinfo(data,(connectdata **)0x0);
    *(curl_socket_t *)local_c8 = cVar4;
    return CURLE_OK;
  case 5:
    if (local_c8 == (double *)0x0) {
      return CURLE_UNKNOWN_OPTION;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_pretransfer;
      break;
    case CURLINFO_STARTTRANSFER_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_appconnect;
      break;
    case CURLINFO_RETRY_AFTER:
      ppVar9 = (pgrs_dir *)&(data->info).retry_after;
      break;
    case 0x60003a:
    case 0x60003b:
    case 0x60003c:
    case 0x60003d:
    case 0x60003e:
    case 0x600042:
      goto switchD_0012df55_default;
    case CURLINFO_XFER_ID:
      ppVar9 = (pgrs_dir *)&data->id;
      break;
    case CURLINFO_CONN_ID:
      ppVar9 = (pgrs_dir *)&(data->state).recent_conn_id;
      if (data->conn != (connectdata *)0x0) {
        ppVar9 = (pgrs_dir *)&data->conn->connection_id;
      }
      break;
    case CURLINFO_QUEUE_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_postqueue;
      break;
    case CURLINFO_POSTTRANSFER_TIME_T:
      ppVar9 = (pgrs_dir *)&(data->progress).t_posttransfer;
      break;
    case CURLINFO_EARLYDATA_SENT_T:
      ppVar9 = (pgrs_dir *)&(data->progress).earlydata_sent;
      break;
    default:
      switch(info) {
      case CURLINFO_SIZE_UPLOAD_T:
        ppVar9 = (pgrs_dir *)&(data->progress).ul.cur_size;
        break;
      case CURLINFO_SIZE_DOWNLOAD_T:
        ppVar9 = (pgrs_dir *)&(data->progress).dl.cur_size;
        break;
      case CURLINFO_SPEED_DOWNLOAD_T:
        ppVar9 = (pgrs_dir *)&(data->progress).dl.speed;
        break;
      case CURLINFO_SPEED_UPLOAD_T:
        ppVar9 = (pgrs_dir *)&(data->progress).ul.speed;
        break;
      default:
        goto switchD_0012df55_default;
      case CURLINFO_FILETIME_T:
        ppVar9 = (pgrs_dir *)&(data->info).filetime;
        break;
      case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
        if (((data->progress).flags & 0x40) == 0) {
LAB_0012e553:
          piVar8 = (ip_quadruple *)0xffffffffffffffff;
          goto LAB_0012e6a6;
        }
        ppVar9 = &(data->progress).dl;
        break;
      case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
        if (((data->progress).flags & 0x20) == 0) goto LAB_0012e553;
        ppVar9 = &(data->progress).ul;
      }
    }
    piVar8 = (ip_quadruple *)ppVar9->total_size;
LAB_0012e6a6:
    *local_c8 = (double)piVar8;
    goto LAB_0012e6bf;
  default:
    goto switchD_0012df55_default;
  }
  switch(info) {
  case CURLINFO_TOTAL_TIME:
    dVar11 = (double)(data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME:
    dVar11 = (double)(data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME:
    dVar11 = (double)(data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME:
    dVar11 = (double)(data->progress).t_pretransfer;
    break;
  case CURLINFO_SIZE_UPLOAD:
    dVar11 = (double)(data->progress).ul.cur_size;
    goto LAB_0012e3de;
  case CURLINFO_SIZE_DOWNLOAD:
    dVar11 = (double)(data->progress).dl.cur_size;
    goto LAB_0012e3de;
  case CURLINFO_SPEED_DOWNLOAD:
    dVar11 = (double)(data->progress).dl.speed;
    goto LAB_0012e3de;
  case CURLINFO_SPEED_UPLOAD:
    dVar11 = (double)(data->progress).ul.speed;
    goto LAB_0012e3de;
  default:
    goto switchD_0012df55_default;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
    if (((data->progress).flags & 0x40) == 0) {
LAB_0012e41e:
      dVar11 = -1.0;
    }
    else {
      dVar11 = (double)(data->progress).dl.total_size;
    }
    goto LAB_0012e3de;
  case CURLINFO_CONTENT_LENGTH_UPLOAD:
    if (((data->progress).flags & 0x20) == 0) goto LAB_0012e41e;
    dVar11 = (double)(data->progress).ul.total_size;
    goto LAB_0012e3de;
  case CURLINFO_STARTTRANSFER_TIME:
    dVar11 = (double)(data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME:
    dVar11 = (double)(data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME:
    dVar11 = (double)(data->progress).t_appconnect;
  }
  dVar11 = dVar11 / 1000000.0;
LAB_0012e3de:
  *local_c8 = dVar11;
LAB_0012e6bf:
  CVar10 = CURLE_OK;
switchD_0012df55_default:
  return CVar10;
}

Assistant:

CURLcode Curl_getinfo(struct Curl_easy *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  curl_off_t *param_offt = NULL;
  const char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  curl_socket_t *param_socketp = NULL;
  int type;
  CURLcode result = CURLE_UNKNOWN_OPTION;

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, const char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_OFF_T:
    param_offt = va_arg(arg, curl_off_t *);
    if(param_offt)
      result = getinfo_offt(data, info, param_offt);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  case CURLINFO_SOCKET:
    param_socketp = va_arg(arg, curl_socket_t *);
    if(param_socketp)
      result = getinfo_socket(data, info, param_socketp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}